

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O0

string * __thiscall
absl::strings_internal::BigUnsigned<4>::ToString_abi_cxx11_(BigUnsigned<4> *this)

{
  int iVar1;
  ulong uVar2;
  undefined8 *in_RSI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  uint32_t next_digit;
  BigUnsigned<4> copy;
  string *result;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  BigUnsigned<4> local_24;
  
  local_24._0_8_ = *in_RSI;
  local_24.words_._4_8_ = in_RSI[1];
  local_24.words_[3] = *(uint32_t *)(in_RSI + 2);
  __first._M_current = in_RDI._M_current;
  std::__cxx11::string::string((string *)in_RDI._M_current);
  while (iVar1 = size(&local_24), 0 < iVar1) {
    DivMod<10u>(&local_24);
    std::__cxx11::string::push_back((char)in_RDI._M_current);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::__cxx11::string::push_back((char)in_RDI._M_current);
  }
  std::__cxx11::string::begin();
  std::__cxx11::string::end();
  std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(__first,in_RDI);
  return (string *)__first._M_current;
}

Assistant:

std::string BigUnsigned<max_words>::ToString() const {
  BigUnsigned<max_words> copy = *this;
  std::string result;
  // Build result in reverse order
  while (copy.size() > 0) {
    uint32_t next_digit = copy.DivMod<10>();
    result.push_back('0' + static_cast<char>(next_digit));
  }
  if (result.empty()) {
    result.push_back('0');
  }
  std::reverse(result.begin(), result.end());
  return result;
}